

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O1

int32_t ulocimp_forLanguageTag_63
                  (char *langtag,int32_t tagLen,char *localeID,int32_t localeIDCapacity,
                  int32_t *parsedLength,UErrorCode *status)

{
  AttributeListEntry *pAVar1;
  char cVar2;
  UBool UVar3;
  char cVar4;
  int32_t size;
  int iVar5;
  int32_t iVar6;
  uint uVar7;
  UErrorCode UVar8;
  ulong uVar9;
  ULanguageTag *langtag_00;
  size_t sVar10;
  char *pcVar11;
  undefined7 extraout_var;
  ExtensionListEntry *pEVar12;
  AttributeListEntry *pAVar13;
  ExtensionListEntry *extraout_RAX;
  uint7 extraout_var_00;
  uint7 uVar18;
  size_t __n;
  VariantListEntry *pVVar14;
  undefined4 extraout_var_01;
  undefined8 uVar15;
  char *pcVar16;
  ExtensionListEntry *pEVar17;
  int iVar19;
  long lVar20;
  char *pcVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  char **ppcVar25;
  char *pcVar26;
  char *pcVar27;
  ulong uVar28;
  AttributeListEntry *pAVar29;
  int iVar30;
  undefined4 uVar31;
  bool bVar32;
  UBool firstValue;
  UBool isDone;
  AttributeListEntry *attrFirst;
  ExtensionListEntry *kwdFirst;
  char bcpKeyBuf [9];
  char attrBuf [100];
  uint local_1dc;
  ExtensionListEntry *local_1d0;
  ExtensionListEntry *local_1c0;
  char *local_1b8;
  char *local_1b0;
  ULanguageTag *local_1a8;
  ULanguageTag *local_1a0;
  char *local_198;
  ulong local_190;
  char *local_188;
  ulong local_180;
  char *local_178;
  char **local_170;
  ExtensionListEntry *local_168;
  undefined4 local_160;
  uint local_15c;
  ExtensionListEntry *local_158;
  char *local_150;
  char *local_148;
  AttributeListEntry *local_140;
  ExtensionListEntry *local_138;
  ExtensionListEntry *local_130;
  char local_121 [9];
  ExtensionListEntry local_118 [5];
  char acStack_98 [104];
  
  uVar9 = (ulong)(uint)tagLen;
  if (parsedLength != (int32_t *)0x0) {
    *parsedLength = 0;
  }
  local_188 = localeID;
  if (U_ZERO_ERROR < *status) goto LAB_002b6bde;
  if (tagLen < 0) {
    uVar9 = strlen(langtag);
  }
  uVar24 = (uint)uVar9;
  pcVar11 = (char *)uprv_malloc_63((long)(int)(uVar24 + 1));
  if (pcVar11 == (char *)0x0) {
LAB_002b6c88:
    *status = U_MEMORY_ALLOCATION_ERROR;
    langtag_00 = (ULanguageTag *)0x0;
  }
  else {
    memcpy(pcVar11,langtag,(long)(int)uVar24);
    pcVar11[(int)uVar24] = '\0';
    langtag_00 = (ULanguageTag *)uprv_malloc_63(0x58);
    if (langtag_00 == (ULanguageTag *)0x0) {
      uprv_free_63(pcVar11);
      goto LAB_002b6c88;
    }
    langtag_00->language = "";
    langtag_00->extlang[0] = (char *)0x0;
    langtag_00->extlang[1] = (char *)0x0;
    langtag_00->extlang[2] = (char *)0x0;
    langtag_00->script = "";
    langtag_00->region = "";
    langtag_00->variants = (VariantListEntry *)0x0;
    langtag_00->extensions = (ExtensionListEntry *)0x0;
    langtag_00->grandfathered = "";
    langtag_00->privateuse = "";
    langtag_00->buf = pcVar11;
    local_168 = (ExtensionListEntry *)parsedLength;
    if (1 < (int)uVar24) {
      local_170 = langtag_00->extlang;
      local_158 = (ExtensionListEntry *)&langtag_00->variants;
      uVar28 = 0xfffffffffffffffe;
      local_1a0 = langtag_00;
      do {
        iVar5 = uprv_stricmp_63(GRANDFATHERED[uVar28 + 2],pcVar11);
        if (iVar5 == 0) {
          pcVar27 = GRANDFATHERED[uVar28 + 3];
          sVar10 = strlen(pcVar27);
          if ((int)uVar24 < (int)sVar10) {
            uprv_free_63(pcVar11);
            pcVar11 = (char *)uprv_malloc_63((ulong)((int)sVar10 + 1));
            if (pcVar11 != (char *)0x0) {
              langtag_00->buf = pcVar11;
              goto LAB_002b78a7;
            }
            *status = U_MEMORY_ALLOCATION_ERROR;
            ultag_close(langtag_00);
            bVar32 = false;
            pcVar11 = (char *)0x0;
            sVar10 = uVar9 & 0xffffffff;
          }
          else {
            sVar10 = uVar9 & 0xffffffff;
LAB_002b78a7:
            strcpy(langtag_00->buf,pcVar27);
            bVar32 = true;
          }
          uVar9 = sVar10 & 0xffffffff;
          if (bVar32) goto LAB_002b78c2;
          langtag_00 = (ULanguageTag *)0x0;
          goto LAB_002b6c98;
        }
        uVar28 = uVar28 + 2;
      } while (uVar28 < 0x32);
      uVar24 = 0;
LAB_002b78c2:
      local_190 = 0;
      local_1a8 = langtag_00;
      local_15c = uVar24;
      if (uVar24 == 0) {
        uVar28 = 0;
        local_180 = 0;
        do {
          pcVar27 = REDUNDANT[uVar28];
          sVar10 = strlen(pcVar27);
          iVar5 = uprv_strnicmp_63(pcVar27,pcVar11,(uint32_t)sVar10);
          bVar32 = true;
          if ((iVar5 == 0) && ((pcVar11[sVar10] == '-' || (pcVar11[sVar10] == '\0')))) {
            pcVar27 = REDUNDANT[uVar28 + 1];
            __n = strlen(pcVar27);
            strncpy(local_1a8->buf,pcVar27,__n);
            if (pcVar11[sVar10] == '-') {
              memmove(pcVar11 + __n,pcVar11 + sVar10,((uVar9 & 0xffffffff) + 1) - sVar10);
            }
            else {
              pcVar11[__n] = '\0';
            }
            local_180 = sVar10 - __n;
            bVar32 = false;
          }
        } while ((uVar28 < 0x32) && (uVar28 = uVar28 + 2, bVar32));
      }
      else {
        local_180 = 0;
      }
      local_1a0 = (ULanguageTag *)&local_1a0->extensions;
      local_1dc = 0x81;
      local_1d0 = (ExtensionListEntry *)0x0;
      local_198 = (char *)0x0;
      local_1b8 = (char *)0x0;
      local_150 = (char *)0x0;
      langtag_00 = local_1a8;
      pcVar27 = pcVar11;
      do {
        if (pcVar11 == (char *)0x0) goto LAB_002b7f9d;
        iVar5 = 0;
        for (pcVar16 = pcVar11; (cVar2 = *pcVar16, cVar2 != '\0' && (cVar2 != '-'));
            pcVar16 = pcVar16 + 1) {
          iVar5 = iVar5 + 1;
        }
        pcVar21 = (char *)0x0;
        if (cVar2 != '\0') {
          pcVar21 = pcVar16 + 1;
        }
        local_1b0 = pcVar27;
        if (((local_1dc & 1) == 0) || (UVar3 = _isLanguageSubtag(pcVar11,iVar5), UVar3 == '\0')) {
          if ((local_1dc & 2) != 0) {
            iVar23 = iVar5;
            if (iVar5 < 0) {
              sVar10 = strlen(pcVar11);
              iVar23 = (int)sVar10;
            }
            if (iVar23 == 3) {
              lVar20 = 0;
              do {
                UVar3 = uprv_isASCIILetter_63(pcVar11[lVar20]);
                langtag_00 = local_1a8;
                if (UVar3 == '\0') break;
                bVar32 = lVar20 != 2;
                lVar20 = lVar20 + 1;
              } while (bVar32);
              if (UVar3 != '\0') {
                *pcVar16 = '\0';
                pcVar11 = T_CString_toLowerCase_63(pcVar11);
                iVar5 = (int)local_190;
                local_190 = (ulong)(iVar5 + 1);
                local_170[iVar5] = pcVar11;
                bVar32 = SBORROW4(iVar5,2);
                iVar5 = iVar5 + -2;
                goto LAB_002b7ac3;
              }
            }
          }
          if (((local_1dc & 4) == 0) || (UVar3 = _isScriptSubtag(pcVar11,iVar5), UVar3 == '\0')) {
            if (((local_1dc & 8) != 0) && (UVar3 = _isRegionSubtag(pcVar11,iVar5), UVar3 != '\0')) {
              *pcVar16 = '\0';
              pcVar11 = T_CString_toUpperCase_63(pcVar11);
              langtag_00->region = pcVar11;
              local_1dc = 0xb0;
              goto LAB_002b7b5f;
            }
            if (((local_1dc & 0x10) == 0) ||
               ((UVar3 = _isVariantSubtag(pcVar11,iVar5), UVar3 == '\0' &&
                (((char)local_150 == '\0' ||
                 (UVar3 = _isPrivateuseVariantSubtag(pcVar11,iVar5), UVar3 == '\0')))))) {
              if (((local_1dc & 0x20) == 0) ||
                 (UVar3 = _isExtensionSingleton(pcVar11,iVar5), pcVar26 = local_1b0, UVar3 == '\0'))
              {
                if (((local_1dc & 0x40) == 0) ||
                   (UVar3 = _isExtensionSubtag(pcVar11,iVar5), UVar3 == '\0')) {
                  iVar23 = 9;
                  pcVar27 = local_1b0;
                  if ((char)local_1dc < '\0') {
                    cVar4 = uprv_asciitolower_63(*pcVar11);
                    pcVar27 = local_1b0;
                    pcVar11 = local_1b8;
                    pcVar16 = pcVar21;
                    if ((iVar5 == 1) && (cVar4 == 'x')) {
                      if (local_1d0 == (ExtensionListEntry *)0x0) {
LAB_002b7e4f:
                        pcVar11 = pcVar27;
                        pcVar26 = pcVar21;
                        if (cVar2 == '\0') {
                          local_1d0 = (ExtensionListEntry *)0x0;
                          pcVar16 = (char *)0x0;
                        }
                        else {
                          do {
                            pcVar27 = pcVar11;
                            if (pcVar26 == (char *)0x0) {
                              pcVar16 = (char *)0x0;
                              break;
                            }
                            iVar5 = 0;
                            for (pcVar11 = pcVar26;
                                (cVar2 = *pcVar11, cVar2 != '\0' && (cVar2 != '-'));
                                pcVar11 = pcVar11 + 1) {
                              iVar5 = iVar5 + 1;
                            }
                            pcVar16 = (char *)0x0;
                            if (cVar2 != '\0') {
                              pcVar16 = pcVar11 + 1;
                            }
                            iVar23 = strncmp(pcVar26,"lvariant",8);
                            if (iVar23 == 0) {
                              *pcVar11 = '\0';
                              uVar15 = CONCAT62((int6)(CONCAT44(extraout_var_01,iVar23) >> 0x10),
                                                0x10);
                              local_1dc = (uint)uVar15;
                              local_150 = (char *)CONCAT71((int7)((ulong)uVar15 >> 8),1);
                              break;
                            }
                            UVar3 = _isPrivateuseValueSubtag(pcVar26,iVar5);
                            pcVar26 = pcVar16;
                          } while (UVar3 != '\0');
                          if ((short)local_1dc == 0x10) {
                            iVar23 = 8;
                            local_1d0 = (ExtensionListEntry *)0x0;
                            pcVar21 = pcVar16;
                            goto LAB_002b7b77;
                          }
                          if (pcVar27 != pcVar21 && -1 < (long)pcVar27 - (long)pcVar21) {
                            *pcVar27 = '\0';
                            pcVar11 = T_CString_toLowerCase_63(pcVar21);
                            langtag_00->privateuse = pcVar11;
                          }
                          local_1d0 = (ExtensionListEntry *)0x0;
                        }
                      }
                      else if (local_1b8 == (char *)0x0 || local_198 == (char *)0x0) {
                        uprv_free_63(local_1d0);
                        local_1d0 = (ExtensionListEntry *)0x0;
                      }
                      else {
                        *local_1b8 = '\0';
                        pcVar27 = T_CString_toLowerCase_63(local_198);
                        local_1d0->value = pcVar27;
                        UVar3 = _addExtensionToList((ExtensionListEntry **)local_1a0,local_1d0,'\0')
                        ;
                        pcVar27 = pcVar11;
                        if (UVar3 != '\0') goto LAB_002b7e4f;
                        uprv_free_63(local_1d0);
                        local_1d0 = (ExtensionListEntry *)0x0;
                        pcVar27 = local_1b0;
                      }
                    }
                    iVar23 = 9;
                    pcVar21 = pcVar16;
                  }
                }
                else {
                  if (local_198 == (char *)0x0) {
                    local_198 = pcVar11;
                  }
                  local_1dc = 0xe0;
                  iVar23 = 8;
                  pcVar27 = local_1b0;
                  local_1b8 = pcVar16;
                }
              }
              else {
                pcVar27 = local_1b0;
                if (local_1d0 == (ExtensionListEntry *)0x0) {
LAB_002b7da2:
                  local_1d0 = (ExtensionListEntry *)uprv_malloc_63(0x18);
                  if (local_1d0 == (ExtensionListEntry *)0x0) {
                    *status = U_MEMORY_ALLOCATION_ERROR;
                    iVar23 = 0xf;
                    local_1d0 = (ExtensionListEntry *)0x0;
                  }
                  else {
                    *pcVar16 = '\0';
                    pcVar11 = T_CString_toLowerCase_63(pcVar11);
                    local_1d0->key = pcVar11;
                    local_1d0->value = (char *)0x0;
                    local_1dc = 0x40;
                    iVar23 = 8;
                    local_198 = (char *)0x0;
                    local_1b8 = (char *)0x0;
                  }
                }
                else {
                  if (local_1b8 != (char *)0x0 && local_198 != (char *)0x0) {
                    *local_1b8 = '\0';
                    pcVar27 = T_CString_toLowerCase_63(local_198);
                    local_1d0->value = pcVar27;
                    UVar3 = _addExtensionToList((ExtensionListEntry **)local_1a0,local_1d0,'\0');
                    pcVar27 = local_1b8;
                    if (UVar3 != '\0') goto LAB_002b7da2;
                  }
                  uprv_free_63(local_1d0);
                  iVar23 = 9;
                  local_1d0 = (ExtensionListEntry *)0x0;
                  pcVar27 = pcVar26;
                }
              }
            }
            else {
              pVVar14 = (VariantListEntry *)uprv_malloc_63(0x10);
              pcVar27 = local_1b0;
              if (pVVar14 == (VariantListEntry *)0x0) {
                *status = U_MEMORY_ALLOCATION_ERROR;
                iVar23 = 0xf;
              }
              else {
                *pcVar16 = '\0';
                pcVar11 = T_CString_toUpperCase_63(pcVar11);
                pVVar14->variant = pcVar11;
                UVar3 = _addVariantToList((VariantListEntry **)local_158,pVVar14);
                if (UVar3 != '\0') {
                  local_1dc = 0xb0;
                  goto LAB_002b7b24;
                }
                uprv_free_63(pVVar14);
                iVar23 = 9;
              }
            }
          }
          else {
            *pcVar16 = '\0';
            cVar2 = uprv_toupper_63(*pcVar11);
            *pcVar11 = cVar2;
            cVar2 = pcVar11[1];
            if (cVar2 != '\0') {
              pcVar27 = pcVar11 + 2;
              do {
                cVar2 = uprv_asciitolower_63(cVar2);
                pcVar27[-1] = cVar2;
                cVar2 = *pcVar27;
                pcVar27 = pcVar27 + 1;
              } while (cVar2 != '\0');
            }
            langtag_00->script = pcVar11;
            local_1dc = 0xb8;
LAB_002b7b24:
            iVar23 = 8;
            pcVar27 = pcVar16;
          }
        }
        else {
          *pcVar16 = '\0';
          pcVar11 = T_CString_toLowerCase_63(pcVar11);
          langtag_00->language = pcVar11;
          bVar32 = SBORROW4(iVar5,4);
          iVar5 = iVar5 + -4;
LAB_002b7ac3:
          local_1dc = (uint)(bVar32 != iVar5 < 0) * 2 + 0xbc;
LAB_002b7b5f:
          iVar23 = 8;
          pcVar27 = pcVar16;
        }
LAB_002b7b77:
        pcVar11 = pcVar21;
      } while (iVar23 == 8);
      if (iVar23 == 0xf) {
        ultag_close(langtag_00);
      }
      else if (iVar23 == 9) {
LAB_002b7f9d:
        pcVar11 = local_1b8;
        pcVar16 = pcVar27;
        if (local_1d0 != (ExtensionListEntry *)0x0) {
          if (local_1b8 != (char *)0x0 && local_198 != (char *)0x0) {
            *local_1b8 = '\0';
            pcVar16 = T_CString_toLowerCase_63(local_198);
            local_1d0->value = pcVar16;
            UVar3 = _addExtensionToList((ExtensionListEntry **)local_1a0,local_1d0,'\0');
            pcVar16 = pcVar11;
            if (UVar3 != '\0') goto LAB_002b7ff7;
          }
          uprv_free_63(local_1d0);
          pcVar16 = pcVar27;
        }
LAB_002b7ff7:
        if (local_168 != (ExtensionListEntry *)0x0) {
          uVar24 = local_15c;
          if ((int)local_15c < 1) {
            uVar24 = ((int)local_180 + (int)pcVar16) - *(int *)&langtag_00->buf;
          }
          *(uint *)&local_168->key = uVar24;
        }
        goto LAB_002b6c98;
      }
LAB_002b6bde:
      langtag_00 = (ULanguageTag *)0x0;
    }
  }
LAB_002b6c98:
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  iVar5 = 0;
  lVar20 = 2;
  do {
    iVar5 = (iVar5 + 1) - (uint)(langtag_00->extlang[lVar20 + -2] == (char *)0x0);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 5);
  pcVar11 = langtag_00->extlang[(ulong)(iVar5 != 0) - 1];
  iVar5 = strcmp(pcVar11,"und");
  ppcVar25 = (char **)0x0;
  if (iVar5 != 0) {
    sVar10 = strlen(pcVar11);
    if (0 < (int)sVar10) {
      if (0 < localeIDCapacity) {
        iVar6 = uprv_min_63((int)sVar10,localeIDCapacity);
        memcpy(local_188,pcVar11,(long)iVar6);
      }
      ppcVar25 = (char **)(sVar10 & 0xffffffff);
    }
  }
  pcVar11 = langtag_00->script;
  sVar10 = strlen(pcVar11);
  pcVar27 = local_188;
  if (0 < (int)sVar10) {
    if ((int)ppcVar25 < localeIDCapacity) {
      local_188[(long)ppcVar25] = '_';
    }
    uVar24 = (int)ppcVar25 + 1;
    cVar2 = *pcVar11;
    if (cVar2 != '\0') {
      lVar20 = 0;
      do {
        if ((int)(uVar24 + (int)lVar20) < localeIDCapacity) {
          if (lVar20 == 0) {
            cVar2 = uprv_toupper_63(cVar2);
          }
          pcVar27[lVar20 + (ulong)uVar24] = cVar2;
        }
        cVar2 = pcVar11[lVar20 + 1];
        lVar20 = lVar20 + 1;
      } while (cVar2 != '\0');
      uVar24 = uVar24 + (int)lVar20;
    }
    ppcVar25 = (char **)(ulong)uVar24;
  }
  pcVar11 = langtag_00->region;
  sVar10 = strlen(pcVar11);
  pcVar27 = local_188;
  if (0 < (int)sVar10) {
    if ((int)ppcVar25 < localeIDCapacity) {
      local_188[(long)ppcVar25] = '_';
    }
    uVar24 = (int)ppcVar25 + 1;
    ppcVar25 = (char **)(ulong)uVar24;
    cVar2 = *pcVar11;
    if (cVar2 != '\0') {
      lVar20 = 0;
      do {
        if ((int)(uVar24 + (int)lVar20) < localeIDCapacity) {
          cVar2 = uprv_toupper_63(cVar2);
          pcVar27[lVar20 + (ulong)uVar24] = cVar2;
        }
        cVar2 = pcVar11[lVar20 + 1];
        lVar20 = lVar20 + 1;
      } while (cVar2 != '\0');
      ppcVar25 = (char **)(ulong)(uVar24 + (int)lVar20);
    }
  }
  iVar5 = 0;
  for (pVVar14 = langtag_00->variants; pVVar14 != (VariantListEntry *)0x0; pVVar14 = pVVar14->next)
  {
    iVar5 = iVar5 + 1;
  }
  if (0 < iVar5) {
    if ((int)sVar10 < 1) {
      if ((int)ppcVar25 < localeIDCapacity) {
        local_188[(long)ppcVar25] = '_';
      }
      ppcVar25 = (char **)(ulong)((int)ppcVar25 + 1);
    }
    iVar23 = 1;
    if (iVar5 < 2) {
      iVar5 = 1;
    }
    iVar30 = 0;
    local_1a8 = langtag_00;
    do {
      pcVar11 = local_188;
      iVar19 = iVar23;
      for (pVVar14 = langtag_00->variants; pVVar14 != (VariantListEntry *)0x0;
          pVVar14 = pVVar14->next) {
        iVar19 = iVar19 + -1;
        if (iVar19 == 0) {
          pcVar27 = pVVar14->variant;
          goto LAB_002b6e5f;
        }
      }
      pcVar27 = (char *)0x0;
LAB_002b6e5f:
      if ((int)ppcVar25 < localeIDCapacity) {
        local_188[(long)ppcVar25] = '_';
      }
      uVar24 = (int)ppcVar25 + 1;
      cVar2 = *pcVar27;
      if (cVar2 != '\0') {
        lVar20 = 0;
        do {
          if ((int)(uVar24 + (int)lVar20) < localeIDCapacity) {
            cVar2 = uprv_toupper_63(cVar2);
            pcVar11[lVar20 + (ulong)uVar24] = cVar2;
          }
          cVar2 = pcVar27[lVar20 + 1];
          lVar20 = lVar20 + 1;
        } while (cVar2 != '\0');
        uVar24 = uVar24 + (int)lVar20;
        langtag_00 = local_1a8;
      }
      ppcVar25 = (char **)(ulong)uVar24;
      iVar30 = iVar30 + 1;
      iVar23 = iVar23 + 1;
    } while (iVar30 != iVar5);
  }
  if ((langtag_00->extensions == (ExtensionListEntry *)0x0) && (*langtag_00->privateuse == '\0'))
  goto LAB_002b6f9d;
  if ((int)ppcVar25 == 0 && langtag_00->extensions != (ExtensionListEntry *)0x0) {
    if (localeIDCapacity < 1) {
      ppcVar25 = (char **)0x3;
    }
    else {
      iVar6 = uprv_min_63(3,localeIDCapacity);
      memcpy(local_188,"und",(long)iVar6);
      ppcVar25 = (char **)0x3;
    }
  }
  local_1c0 = (ExtensionListEntry *)0x0;
  iVar6 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar5 = localeIDCapacity - (int)ppcVar25;
    local_170 = ppcVar25;
    pcVar11 = (char *)uprv_malloc_63((long)iVar5);
    if (pcVar11 == (char *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      ppcVar25 = local_170;
    }
    else {
      local_1d0._0_1_ = langtag_00->variants != (VariantListEntry *)0x0;
      iVar23 = 0;
      for (pEVar17 = langtag_00->extensions; pEVar17 != (ExtensionListEntry *)0x0;
          pEVar17 = pEVar17->next) {
        iVar23 = iVar23 + 1;
      }
      uVar9 = (ulong)local_170 & 0xffffffff;
      local_1b0 = pcVar11;
      local_1a8 = langtag_00;
      if (0 < iVar23) {
        iVar30 = 1;
        iVar19 = 0;
        local_1b8 = (char *)CONCAT44(local_1b8._4_4_,iVar23);
        do {
          pcVar11 = (char *)langtag_00->extensions;
          iVar22 = iVar30;
          for (pEVar17 = (ExtensionListEntry *)pcVar11; pEVar17 != (ExtensionListEntry *)0x0;
              pEVar17 = pEVar17->next) {
            iVar22 = iVar22 + -1;
            if (iVar22 == 0) {
              pcVar27 = pEVar17->key;
              goto LAB_002b70bb;
            }
          }
          pcVar27 = (char *)0x0;
LAB_002b70bb:
          local_180 = CONCAT44(local_180._4_4_,iVar19);
          iVar19 = iVar30;
          for (; (ExtensionListEntry *)pcVar11 != (ExtensionListEntry *)0x0;
              pcVar11 = (char *)((ExtensionListEntry *)pcVar11)->next) {
            iVar19 = iVar19 + -1;
            if (iVar19 == 0) {
              pcVar16 = ((ExtensionListEntry *)pcVar11)->value;
              goto LAB_002b70dd;
            }
          }
          pcVar16 = (char *)0x0;
LAB_002b70dd:
          if (*pcVar27 != 'u') {
            pEVar17 = (ExtensionListEntry *)uprv_malloc_63(0x18);
            if (pEVar17 == (ExtensionListEntry *)0x0) {
              UVar8 = U_MEMORY_ALLOCATION_ERROR;
            }
            else {
              pEVar17->key = pcVar27;
              pEVar17->value = pcVar16;
              UVar3 = _addExtensionToList(&local_1c0,pEVar17,'\0');
              if (UVar3 != '\0') {
                goto LAB_002b7875;
              }
              uprv_free_63(pEVar17);
              UVar8 = U_ILLEGAL_ARGUMENT_ERROR;
            }
            *status = UVar8;
            break;
          }
          local_190 = CONCAT44(local_190._4_4_,iVar30);
          local_138 = (ExtensionListEntry *)0x0;
          local_140 = (AttributeListEntry *)0x0;
          iVar23 = 0;
          pcVar27 = (char *)0x0;
          if (*pcVar16 != '\0') {
            pEVar17 = (ExtensionListEntry *)0x0;
            pcVar27 = pcVar16;
            do {
              sVar10 = 0;
              for (pcVar16 = pcVar27; (*pcVar16 != '\0' && (*pcVar16 != '-')); pcVar16 = pcVar16 + 1
                  ) {
                sVar10 = sVar10 + 1;
              }
              iVar23 = (int)sVar10;
              UVar3 = ultag_isUnicodeLocaleKey_63(pcVar27,iVar23);
              pcVar11 = (char *)CONCAT71(extraout_var,UVar3);
              if (UVar3 != '\0') goto LAB_002b722d;
              pEVar12 = (ExtensionListEntry *)uprv_malloc_63(0x10);
              if (pEVar12 == (ExtensionListEntry *)0x0) {
                *status = U_MEMORY_ALLOCATION_ERROR;
                langtag_00 = local_1a8;
                goto LAB_002b7819;
              }
              iVar30 = (int)pEVar17;
              if (100 - iVar30 <= iVar23) {
LAB_002b7213:
                *status = U_ILLEGAL_ARGUMENT_ERROR;
                goto LAB_002b7220;
              }
              memcpy(acStack_98 + (long)pEVar17,pcVar27,sVar10);
              acStack_98[(uint)(iVar30 + iVar23)] = '\0';
              pEVar12->key = acStack_98 + (long)pEVar17;
              UVar3 = _addAttributeToList(&local_140,(AttributeListEntry *)pEVar12);
              if (UVar3 == '\0') goto LAB_002b7213;
              pcVar27 = pcVar16 + (*pcVar16 != '\0');
              pEVar17 = (ExtensionListEntry *)(ulong)(iVar30 + iVar23 + 1);
            } while (*pcVar27 != '\0');
            pcVar27 = (char *)0x0;
            pcVar11 = (char *)pEVar17;
            pEVar17 = (ExtensionListEntry *)(ulong)(iVar30 + iVar23 + 1);
LAB_002b722d:
            iVar23 = (int)pEVar17;
            langtag_00 = local_1a8;
          }
          pAVar29 = local_140;
          uVar24 = 0;
          if (local_140 == (AttributeListEntry *)0x0) {
LAB_002b7337:
            pEVar17 = (ExtensionListEntry *)0x0;
            if (pcVar27 == (char *)0x0) {
              uVar31 = 0;
              iVar23 = (int)local_1b8;
              iVar30 = (int)local_190;
LAB_002b77e7:
              pEVar17 = local_138;
              while (pEVar17 != (ExtensionListEntry *)0x0) {
                pEVar12 = pEVar17->next;
                _addExtensionToList(&local_1c0,pEVar17,'\0');
                pEVar17 = pEVar12;
              }
            }
            else {
              local_160 = 0;
              pcVar16 = (char *)0x0;
              local_198 = (char *)0x0;
              local_1a0 = (ULanguageTag *)0x0;
              local_168 = (ExtensionListEntry *)0x0;
              do {
                if ((char)local_168 != '\0') {
                  iVar19 = 0;
                  break;
                }
                if (*pcVar27 == '\0') {
                  local_168 = (ExtensionListEntry *)CONCAT71((int7)((ulong)pcVar11 >> 8),1);
                  pcVar21 = (char *)0x0;
                  uVar7 = 0;
                  pcVar11 = (char *)0x0;
                }
                else {
                  for (pEVar12 = (ExtensionListEntry *)0x0;
                      (cVar2 = *(char *)((long)&pEVar12->key + (long)pcVar27), cVar2 != '\0' &&
                      (cVar2 != '-')); pEVar12 = (ExtensionListEntry *)((long)&pEVar12->key + 1)) {
                  }
                  uVar7 = (uint)pEVar12;
                  UVar3 = ultag_isUnicodeLocaleKey_63(pcVar27,uVar7);
                  pcVar26 = pcVar16;
                  if (UVar3 == '\0') {
                    if (local_198 == (char *)0x0) {
                      local_1a0 = (ULanguageTag *)((ulong)pEVar12 & 0xffffffff);
                      uVar18 = extraout_var_00;
                      local_198 = pcVar27;
                    }
                    else {
                      uVar7 = (int)local_1a0 + uVar7 + 1;
                      local_1a0 = (ULanguageTag *)(ulong)uVar7;
                      uVar18 = (uint7)(uint3)(uVar7 >> 8);
                    }
                    pcVar21 = (char *)0x0;
                    pcVar11 = (char *)CONCAT71(uVar18,1);
                    uVar7 = 0;
                  }
                  else {
                    bVar32 = pcVar16 == (char *)0x0;
                    if (bVar32) {
                      pEVar17 = pEVar12;
                    }
                    pEVar17 = (ExtensionListEntry *)((ulong)pEVar17 & 0xffffffff);
                    pcVar21 = pcVar27;
                    if (bVar32) {
                      pcVar26 = pcVar27;
                      pcVar21 = pcVar16;
                    }
                    pcVar11 = (char *)CONCAT71(extraout_var_00,bVar32);
                    if (bVar32) {
                      uVar7 = 0;
                    }
                  }
                  pcVar27 = pcVar27 + (long)((long)&pEVar12->key +
                                            (ulong)(*(char *)((long)&pEVar12->key + (long)pcVar27)
                                                   != '\0'));
                  pcVar16 = pcVar26;
                }
                iVar19 = 0;
                if ((char)pcVar11 == '\0') {
                  if ((int)pEVar17 < 9) {
                    sVar10 = (size_t)(int)pEVar17;
                    local_15c = uVar7;
                    local_158 = pEVar17;
                    local_150 = pcVar21;
                    strncpy(local_121,pcVar16,sVar10);
                    local_121[sVar10] = '\0';
                    pcVar11 = uloc_toLegacyKey_63(local_121);
                    if (pcVar11 == (char *)0x0) {
                      *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002b76c7:
                      pcVar11 = (char *)0x0;
                      iVar19 = 7;
                      pEVar17 = local_158;
                    }
                    else {
                      local_178 = pcVar16;
                      if (pcVar11 == local_121) {
                        T_CString_toLowerCase_63(local_121);
                        pcVar16 = local_1b0;
                        pcVar11 = (char *)(ulong)(~uVar24 + iVar5);
                        iVar23 = (int)local_158;
                        if ((int)(~uVar24 + iVar5) < iVar23) {
                          *status = U_BUFFER_OVERFLOW_ERROR;
                          iVar19 = 7;
                          pEVar17 = local_158;
                          pcVar16 = local_178;
                          goto LAB_002b76d7;
                        }
                        local_148 = local_1b0 + (int)uVar24;
                        memcpy(local_148,local_121,sVar10);
                        pcVar16[(int)(iVar23 + uVar24)] = '\0';
                        uVar24 = uVar24 + iVar23 + 1;
                        pcVar11 = local_148;
                      }
                      local_148 = pcVar11;
                      if (local_198 == (char *)0x0) {
                        pcVar11 = "yes";
                      }
                      else {
                        if ((int)local_1a0 < 0x80) {
                          sVar10 = (size_t)(int)local_1a0;
                          strncpy((char *)local_118,local_198,sVar10);
                          *(undefined1 *)((long)&local_118[0].key + sVar10) = 0;
                          pcVar11 = uloc_toLegacyType_63(local_148,(char *)local_118);
                          if ((ExtensionListEntry *)pcVar11 == (ExtensionListEntry *)0x0)
                          goto LAB_002b75c7;
                          iVar19 = 0;
                          bVar32 = true;
                          if ((ExtensionListEntry *)pcVar11 == local_118) {
                            local_130 = (ExtensionListEntry *)pcVar11;
                            T_CString_toLowerCase_63((char *)local_118);
                            pcVar16 = local_1b0;
                            if ((int)(~uVar24 + iVar5) < (int)local_1a0) {
                              *status = U_BUFFER_OVERFLOW_ERROR;
                              iVar19 = 7;
                              pcVar11 = (char *)local_130;
                              bVar32 = false;
                            }
                            else {
                              pcVar11 = local_1b0 + (int)uVar24;
                              memcpy(pcVar11,local_118,sVar10);
                              pcVar16[(int)(uVar24 + (int)local_1a0)] = '\0';
                              uVar24 = uVar24 + (int)local_1a0 + 1;
                              bVar32 = true;
                            }
                          }
                        }
                        else {
LAB_002b75c7:
                          *status = U_ILLEGAL_ARGUMENT_ERROR;
                          iVar19 = 7;
                          pcVar11 = (char *)0x0;
                          bVar32 = false;
                        }
                        pEVar17 = local_158;
                        langtag_00 = local_1a8;
                        pcVar16 = local_178;
                        if (!bVar32) goto LAB_002b76d7;
                      }
                      if ((((char)local_1d0 == '\0') &&
                          (iVar23 = strcmp(local_148,"va"), iVar23 == 0)) &&
                         (iVar23 = strcmp(pcVar11,"posix"), iVar23 == 0)) {
                        local_160 = 1;
                        pcVar16 = local_150;
                      }
                      else {
                        pEVar17 = (ExtensionListEntry *)uprv_malloc_63(0x18);
                        if (pEVar17 == (ExtensionListEntry *)0x0) {
                          *status = U_MEMORY_ALLOCATION_ERROR;
                          pcVar16 = local_178;
                          goto LAB_002b76c7;
                        }
                        pEVar17->key = local_148;
                        pEVar17->value = pcVar11;
                        UVar3 = _addExtensionToList(&local_138,pEVar17,'\0');
                        pcVar16 = local_150;
                        if (UVar3 == '\0') {
                          uprv_free_63(pEVar17);
                        }
                      }
                      local_198 = (char *)0x0;
                      pcVar11 = (char *)(ulong)local_15c;
                      if (pcVar16 == (char *)0x0) {
                        pcVar11 = (char *)(ExtensionListEntry *)0x0;
                      }
                      local_1a0 = (ULanguageTag *)0x0;
                      iVar19 = 0;
                      pEVar17 = (ExtensionListEntry *)pcVar11;
                    }
                  }
                  else {
                    *status = U_ILLEGAL_ARGUMENT_ERROR;
                    iVar19 = 7;
                  }
                }
LAB_002b76d7:
              } while (iVar19 == 0);
              pAVar29 = local_140;
              uVar31 = local_160;
              iVar30 = (int)local_190;
              iVar23 = (int)local_1b8;
              if (iVar19 == 7) goto joined_r0x002b782e;
              if (iVar19 == 0) goto LAB_002b77e7;
            }
          }
          else {
            if (iVar5 < iVar23) {
              *status = U_ILLEGAL_ARGUMENT_ERROR;
            }
            else {
              pEVar17 = (ExtensionListEntry *)uprv_malloc_63(0x18);
              if (pEVar17 == (ExtensionListEntry *)0x0) {
                *status = U_MEMORY_ALLOCATION_ERROR;
              }
              else {
                pEVar17->key = "attribute";
                pEVar17->value = local_1b0;
                iVar23 = 0;
                pAVar13 = pAVar29;
                local_168 = pEVar17;
                do {
                  pcVar11 = local_1b0;
                  pAVar1 = pAVar13->next;
                  if (pAVar13 != pAVar29) {
                    local_1b0[iVar23] = '-';
                    iVar23 = iVar23 + 1;
                  }
                  pcVar16 = pAVar13->attribute;
                  sVar10 = strlen(pcVar16);
                  memcpy(pcVar11 + iVar23,pcVar16,(long)(int)sVar10);
                  pEVar12 = local_168;
                  iVar23 = (int)sVar10 + iVar23;
                  pAVar13 = pAVar1;
                } while (pAVar1 != (AttributeListEntry *)0x0);
                local_1b0[iVar23] = '\0';
                UVar3 = _addExtensionToList(&local_138,local_168,'\0');
                langtag_00 = local_1a8;
                if (UVar3 != '\0') {
                  uVar24 = iVar23 + 1;
                  do {
                    pAVar13 = pAVar29->next;
                    uprv_free_63(pAVar29);
                    pAVar29 = pAVar13;
                  } while (pAVar13 != (AttributeListEntry *)0x0);
                  local_140 = (AttributeListEntry *)0x0;
                  pcVar11 = (char *)extraout_RAX;
                  goto LAB_002b7337;
                }
                *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002b7220:
                uprv_free_63(pEVar12);
                langtag_00 = local_1a8;
              }
            }
LAB_002b7819:
            pAVar29 = local_140;
            uVar31 = 0;
            iVar30 = (int)local_190;
            iVar23 = (int)local_1b8;
joined_r0x002b782e:
            while (pEVar17 = local_138, pAVar29 != (AttributeListEntry *)0x0) {
              pAVar13 = pAVar29->next;
              uprv_free_63(pAVar29);
              pAVar29 = pAVar13;
            }
            while (pEVar17 != (ExtensionListEntry *)0x0) {
              pEVar12 = pEVar17->next;
              uprv_free_63(pEVar17);
              pEVar17 = pEVar12;
            }
          }
          local_1d0._0_1_ = (char)uVar31;
          if (U_ZERO_ERROR < *status) break;
LAB_002b7875:
          iVar19 = (int)local_180 + 1;
          iVar30 = iVar30 + 1;
        } while (iVar19 != iVar23);
      }
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pcVar11 = langtag_00->privateuse;
        sVar10 = strlen(pcVar11);
        if (0 < (int)sVar10) {
          pEVar17 = (ExtensionListEntry *)uprv_malloc_63(0x18);
          if (pEVar17 == (ExtensionListEntry *)0x0) {
            UVar8 = U_MEMORY_ALLOCATION_ERROR;
          }
          else {
            pEVar17->key = "x";
            pEVar17->value = pcVar11;
            UVar3 = _addExtensionToList(&local_1c0,pEVar17,'\0');
            if (UVar3 != '\0') goto LAB_002b8072;
            uprv_free_63(pEVar17);
            UVar8 = U_ILLEGAL_ARGUMENT_ERROR;
          }
          *status = UVar8;
        }
      }
LAB_002b8072:
      pcVar11 = local_188 + uVar9;
      iVar23 = 0;
      if (((*status < U_ILLEGAL_ARGUMENT_ERROR) && (iVar23 = 0, (char)local_1d0 != '\0')) &&
         (iVar23 = 6, 0 < iVar5)) {
        iVar6 = uprv_min_63(6,iVar5);
        memcpy(pcVar11,"_POSIX",(long)iVar6);
      }
      pEVar17 = local_1c0;
      if (local_1c0 != (ExtensionListEntry *)0x0 && *status < U_ILLEGAL_ARGUMENT_ERROR) {
        local_180 = CONCAT44(local_180._4_4_,(int)CONCAT71((int7)((ulong)status >> 8),1));
        pEVar12 = local_1c0;
        do {
          if (iVar23 < iVar5) {
            pcVar11[iVar23] = ((char)local_180 != '\0') * '\x05' + ';';
            local_180 = local_180 & 0xffffffff00000000;
          }
          iVar23 = iVar23 + 1;
          pcVar27 = pEVar12->key;
          sVar10 = strlen(pcVar27);
          if (iVar5 - iVar23 != 0 && iVar23 <= iVar5) {
            iVar6 = uprv_min_63((int)sVar10,iVar5 - iVar23);
            memcpy(pcVar11 + iVar23,pcVar27,(long)iVar6);
          }
          iVar23 = iVar23 + (int)sVar10;
          if (iVar23 < iVar5) {
            pcVar11[iVar23] = '=';
          }
          iVar23 = iVar23 + 1;
          pcVar27 = pEVar12->value;
          sVar10 = strlen(pcVar27);
          if (iVar5 - iVar23 != 0 && iVar23 <= iVar5) {
            iVar6 = uprv_min_63((int)sVar10,iVar5 - iVar23);
            memcpy(pcVar11 + iVar23,pcVar27,(long)iVar6);
          }
          iVar23 = iVar23 + (int)sVar10;
          pEVar12 = pEVar12->next;
        } while (pEVar12 != (ExtensionListEntry *)0x0);
      }
      while (pEVar17 != (ExtensionListEntry *)0x0) {
        pEVar12 = pEVar17->next;
        uprv_free_63(pEVar17);
        pEVar17 = pEVar12;
      }
      uprv_free_63(local_1b0);
      langtag_00 = local_1a8;
      iVar6 = 0;
      ppcVar25 = local_170;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar6 = u_terminateChars_63(pcVar11,iVar5,iVar23,status);
        ppcVar25 = local_170;
      }
    }
  }
  ppcVar25 = (char **)(ulong)(uint)(iVar6 + (int)ppcVar25);
LAB_002b6f9d:
  ultag_close(langtag_00);
  iVar6 = u_terminateChars_63(local_188,localeIDCapacity,(int32_t)ppcVar25,status);
  return iVar6;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ulocimp_forLanguageTag(const char* langtag,
                       int32_t tagLen,
                       char* localeID,
                       int32_t localeIDCapacity,
                       int32_t* parsedLength,
                       UErrorCode* status) {
    ULanguageTag *lt;
    int32_t reslen = 0;
    const char *subtag, *p;
    int32_t len;
    int32_t i, n;
    UBool noRegion = TRUE;

    lt = ultag_parse(langtag, tagLen, parsedLength, status);
    if (U_FAILURE(*status)) {
        return 0;
    }

    /* language */
    subtag = ultag_getExtlangSize(lt) > 0 ? ultag_getExtlang(lt, 0) : ultag_getLanguage(lt);
    if (uprv_compareInvCharsAsAscii(subtag, LANG_UND) != 0) {
        len = (int32_t)uprv_strlen(subtag);
        if (len > 0) {
            if (reslen < localeIDCapacity) {
                uprv_memcpy(localeID, subtag, uprv_min(len, localeIDCapacity - reslen));
            }
            reslen += len;
        }
    }

    /* script */
    subtag = ultag_getScript(lt);
    len = (int32_t)uprv_strlen(subtag);
    if (len > 0) {
        if (reslen < localeIDCapacity) {
            *(localeID + reslen) = LOCALE_SEP;
        }
        reslen++;

        /* write out the script in title case */
        p = subtag;
        while (*p) {
            if (reslen < localeIDCapacity) {
                if (p == subtag) {
                    *(localeID + reslen) = uprv_toupper(*p);
                } else {
                    *(localeID + reslen) = *p;
                }
            }
            reslen++;
            p++;
        }
    }

    /* region */
    subtag = ultag_getRegion(lt);
    len = (int32_t)uprv_strlen(subtag);
    if (len > 0) {
        if (reslen < localeIDCapacity) {
            *(localeID + reslen) = LOCALE_SEP;
        }
        reslen++;
        /* write out the retion in upper case */
        p = subtag;
        while (*p) {
            if (reslen < localeIDCapacity) {
                *(localeID + reslen) = uprv_toupper(*p);
            }
            reslen++;
            p++;
        }
        noRegion = FALSE;
    }

    /* variants */
    n = ultag_getVariantsSize(lt);
    if (n > 0) {
        if (noRegion) {
            if (reslen < localeIDCapacity) {
                *(localeID + reslen) = LOCALE_SEP;
            }
            reslen++;
        }

        for (i = 0; i < n; i++) {
            subtag = ultag_getVariant(lt, i);
            if (reslen < localeIDCapacity) {
                *(localeID + reslen) = LOCALE_SEP;
            }
            reslen++;
            /* write out the variant in upper case */
            p = subtag;
            while (*p) {
                if (reslen < localeIDCapacity) {
                    *(localeID + reslen) = uprv_toupper(*p);
                }
                reslen++;
                p++;
            }
        }
    }

    /* keywords */
    n = ultag_getExtensionsSize(lt);
    subtag = ultag_getPrivateUse(lt);
    if (n > 0 || uprv_strlen(subtag) > 0) {
        if (reslen == 0 && n > 0) {
            /* need a language */
            if (reslen < localeIDCapacity) {
                uprv_memcpy(localeID + reslen, LANG_UND, uprv_min(LANG_UND_LEN, localeIDCapacity - reslen));
            }
            reslen += LANG_UND_LEN;
        }
        len = _appendKeywords(lt, localeID + reslen, localeIDCapacity - reslen, status);
        reslen += len;
    }

    ultag_close(lt);
    return u_terminateChars(localeID, localeIDCapacity, reslen, status);
}